

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

void __thiscall
QSocks5SocketEnginePrivate::setErrorState
          (QSocks5SocketEnginePrivate *this,Socks5State state,Socks5Error socks5error)

{
  QAbstractSocketEngine *this_00;
  SocketError error;
  char *pcVar1;
  QArrayDataPointer<char16_t> *this_01;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractSocketEngine **)&(this->super_QAbstractSocketEnginePrivate).field_0x8;
  switch(socks5error) {
  case SocksFailure:
    pcVar1 = "General SOCKSv5 server failure";
    goto LAB_0021f2e2;
  case ConnectionNotAllowed:
    QSocks5SocketEngine::tr
              ((QString *)&local_58,"Connection not allowed by SOCKSv5 server",(char *)0x0,-1);
    error = SocketAccessError;
    break;
  case NetworkUnreachable:
    QAbstractSocket::tr((QString *)&local_58,"Network unreachable",(char *)0x0,-1);
    goto LAB_0021f2f4;
  case HostUnreachable:
    QAbstractSocket::tr((QString *)&local_58,"Host not found",(char *)0x0,-1);
    error = HostNotFoundError;
    break;
  case ConnectionRefused:
    QAbstractSocket::tr((QString *)&local_58,"Connection refused",(char *)0x0,-1);
    error = ConnectionRefusedError;
    break;
  case TTLExpired:
    pcVar1 = "TTL expired";
LAB_0021f2e2:
    QSocks5SocketEngine::tr((QString *)&local_58,pcVar1,(char *)0x0,-1);
LAB_0021f2f4:
    error = NetworkError;
    break;
  case CommandNotSupported:
    pcVar1 = "SOCKSv5 command not supported";
    goto LAB_0021f2ff;
  case AddressTypeNotSupported:
    pcVar1 = "Address type not supported";
LAB_0021f2ff:
    QSocks5SocketEngine::tr((QString *)&local_58,pcVar1,(char *)0x0,-1);
    error = UnsupportedSocketOperationError;
    break;
  default:
    this_01 = &local_70;
    QSocks5SocketEngine::tr
              ((QString *)this_01,"Unknown SOCKSv5 proxy error code 0x%1",(char *)0x0,-1);
    QString::arg<int,_true>((QString *)&local_58,(QString *)this_01,socks5error,0x10,10,(QChar)0x20)
    ;
    QAbstractSocketEngine::setError(this_00,UnknownSocketError,(QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    goto LAB_0021f31f;
  }
  this_01 = &local_58;
  QAbstractSocketEngine::setError(this_00,error,(QString *)this_01);
LAB_0021f31f:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_01);
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_58.size = 0;
  setErrorState(this,state,(QString *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSocks5SocketEnginePrivate::setErrorState(Socks5State state, Socks5Error socks5error)
{
    Q_Q(QSocks5SocketEngine);
    switch (socks5error) {
    case SocksFailure:
        q->setError(QAbstractSocket::NetworkError,
                     QSocks5SocketEngine::tr("General SOCKSv5 server failure"));
        break;
    case ConnectionNotAllowed:
        q->setError(QAbstractSocket::SocketAccessError,
                     QSocks5SocketEngine::tr("Connection not allowed by SOCKSv5 server"));
        break;
    case NetworkUnreachable:
        q->setError(QAbstractSocket::NetworkError,
                    QAbstractSocket::tr("Network unreachable"));
        break;
    case HostUnreachable:
        q->setError(QAbstractSocket::HostNotFoundError,
                    QAbstractSocket::tr("Host not found"));
        break;
    case ConnectionRefused:
        q->setError(QAbstractSocket::ConnectionRefusedError,
                    QAbstractSocket::tr("Connection refused"));
        break;
    case TTLExpired:
        q->setError(QAbstractSocket::NetworkError,
                     QSocks5SocketEngine::tr("TTL expired"));
        break;
    case CommandNotSupported:
        q->setError(QAbstractSocket::UnsupportedSocketOperationError,
                     QSocks5SocketEngine::tr("SOCKSv5 command not supported"));
        break;
    case AddressTypeNotSupported:
        q->setError(QAbstractSocket::UnsupportedSocketOperationError,
                     QSocks5SocketEngine::tr("Address type not supported"));
        break;

    default:
        q->setError(QAbstractSocket::UnknownSocketError,
                     QSocks5SocketEngine::tr("Unknown SOCKSv5 proxy error code 0x%1").arg(int(socks5error), 16));
        break;
    }

    setErrorState(state, QString());
}